

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O1

size_t colamd_recommended(int nnz,int n_row,int n_col)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  if (-1 < (n_row | nnz | n_col)) {
    uVar6 = (ulong)(uint)nnz;
    bVar9 = true;
    lVar1 = 2;
    uVar3 = 0;
    do {
      if (bVar9) {
        uVar4 = uVar6;
        if (uVar6 < uVar3) {
          uVar4 = uVar3;
        }
        bVar9 = uVar4 <= uVar3 + uVar6;
      }
      else {
        bVar9 = false;
      }
      if (bVar9) {
        uVar3 = uVar3 + uVar6;
      }
      else {
        uVar3 = 0;
      }
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
    uVar5 = (ulong)(uint)n_col;
    uVar2 = 0;
    uVar4 = uVar5 + 1;
    if (!bVar9) {
      uVar4 = uVar2;
    }
    lVar1 = 0x18;
    do {
      if (bVar9) {
        uVar7 = uVar4;
        if (uVar4 < uVar2) {
          uVar7 = uVar2;
        }
        bVar9 = uVar7 <= uVar2 + uVar4;
      }
      else {
        bVar9 = false;
      }
      if (bVar9) {
        uVar2 = uVar2 + uVar4;
      }
      else {
        uVar2 = 0;
      }
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
    uVar7 = 0;
    uVar4 = (ulong)(uint)n_row + 1;
    if (!bVar9) {
      uVar4 = uVar7;
    }
    lVar1 = 0x10;
    do {
      if (bVar9) {
        uVar8 = uVar4;
        if (uVar4 < uVar7) {
          uVar8 = uVar7;
        }
        bVar9 = uVar8 <= uVar7 + uVar4;
      }
      else {
        bVar9 = false;
      }
      if (bVar9) {
        uVar7 = uVar7 + uVar4;
      }
      else {
        uVar7 = 0;
      }
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
    uVar2 = uVar2 >> 2;
    if (bVar9) {
      uVar4 = uVar2;
      if (uVar2 < uVar3) {
        uVar4 = uVar3;
      }
      bVar9 = uVar4 <= uVar2 + uVar3;
    }
    else {
      bVar9 = false;
    }
    uVar7 = uVar7 >> 2;
    uVar2 = uVar2 + uVar3;
    uVar4 = 0;
    uVar3 = uVar4;
    if (bVar9) {
      uVar3 = uVar7;
      if (uVar7 < uVar2) {
        uVar3 = uVar2;
      }
      uVar4 = (ulong)(uVar3 <= uVar2 + uVar7);
      uVar3 = uVar2;
    }
    uVar3 = uVar3 + uVar7;
    uVar7 = 0;
    uVar2 = uVar7;
    if ((char)uVar4 != '\0') {
      uVar4 = uVar5;
      if (uVar5 < uVar3) {
        uVar4 = uVar3;
      }
      uVar7 = (ulong)(uVar4 <= uVar3 + uVar5);
      uVar2 = uVar3;
    }
    uVar2 = uVar2 + uVar5;
    uVar6 = uVar6 / 5;
    uVar4 = 0;
    uVar3 = uVar4;
    if ((char)uVar7 != '\0') {
      uVar3 = uVar6;
      if (uVar6 < uVar2) {
        uVar3 = uVar2;
      }
      uVar4 = (ulong)(uVar3 <= uVar2 + uVar6);
      uVar3 = uVar2;
    }
    uVar2 = 0;
    uVar6 = uVar3 + uVar6;
    if ((char)uVar4 == '\0') {
      uVar6 = uVar2;
    }
    if (0x7ffffffe < uVar6) {
      uVar6 = uVar2;
    }
    if ((char)uVar4 == '\0') {
      uVar6 = uVar2;
    }
    return uVar6;
  }
  return 0;
}

Assistant:

PUBLIC size_t COLAMD_recommended	/* returns recommended value of Alen. */
(
    /* === Parameters ======================================================= */

    Int nnz,			/* number of nonzeros in A */
    Int n_row,			/* number of rows in A */
    Int n_col			/* number of columns in A */
)
{
    size_t s, c, r ;
    int ok = TRUE ;
    if (nnz < 0 || n_row < 0 || n_col < 0)
    {
	return (0) ;
    }
    s = t_mult (nnz, 2, &ok) ;	    /* 2*nnz */
    c = COLAMD_C (n_col, &ok) ;	    /* size of column structures */
    r = COLAMD_R (n_row, &ok) ;	    /* size of row structures */
    s = t_add (s, c, &ok) ;
    s = t_add (s, r, &ok) ;
    s = t_add (s, n_col, &ok) ;	    /* elbow room */
    s = t_add (s, nnz/5, &ok) ;	    /* elbow room */
    ok = ok && (s < Int_MAX) ;
    return (ok ? s : 0) ;
}